

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_reservoir_sample.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalReservoirSample::GetData
          (PhysicalReservoirSample *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  int iVar1;
  DataChunk *in_RAX;
  pointer pGVar2;
  pointer pBVar3;
  type chunk_00;
  SourceResultType SVar4;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> sample_chunk;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(pGVar2 + 1));
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  if (pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__prev
      != (__pthread_internal_list *)0x0) {
    pBVar3 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                         *)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                            .__data.__list);
    (*pBVar3->_vptr_BlockingSample[6])(&local_28,pBVar3);
    if (local_28._M_head_impl != (DataChunk *)0x0) {
      chunk_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&local_28);
      DataChunk::Move(chunk,chunk_00);
      if (local_28._M_head_impl != (DataChunk *)0x0) {
        DataChunk::~DataChunk(local_28._M_head_impl);
        operator_delete(local_28._M_head_impl);
      }
      SVar4 = HAVE_MORE_OUTPUT;
      goto LAB_0168e31a;
    }
  }
  SVar4 = FINISHED;
LAB_0168e31a:
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar2 + 1));
  return SVar4;
}

Assistant:

SourceResultType PhysicalReservoirSample::GetData(ExecutionContext &context, DataChunk &chunk,
                                                  OperatorSourceInput &input) const {
	auto &sink = this->sink_state->Cast<SampleGlobalSinkState>();
	lock_guard<mutex> glock(sink.lock);
	if (!sink.sample) {
		return SourceResultType::FINISHED;
	}
	auto sample_chunk = sink.sample->GetChunk();

	if (!sample_chunk) {
		return SourceResultType::FINISHED;
	}
	chunk.Move(*sample_chunk);

	return SourceResultType::HAVE_MORE_OUTPUT;
}